

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Memory64Lowering.cpp
# Opt level: O0

void __thiscall wasm::Memory64Lowering::visitTableCopy(Memory64Lowering *this,TableCopy *curr)

{
  TableCopy *curr_local;
  Memory64Lowering *this_local;
  
  wrapTableAddress64(this,&curr->dest,(Name)(curr->destTable).super_IString.str);
  wrapTableAddress64(this,&curr->source,(Name)(curr->sourceTable).super_IString.str);
  wrapTableAddress64(this,&curr->size,(Name)(curr->destTable).super_IString.str);
  return;
}

Assistant:

void visitTableCopy(TableCopy* curr) {
    wrapTableAddress64(curr->dest, curr->destTable);
    wrapTableAddress64(curr->source, curr->sourceTable);
    wrapTableAddress64(curr->size, curr->destTable);
  }